

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

Test * BuildWithLogTestImplicitGeneratedOutOfDate::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x4c8);
  BuildWithLogTestImplicitGeneratedOutOfDate((BuildWithLogTestImplicitGeneratedOutOfDate *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(BuildWithLogTest, ImplicitGeneratedOutOfDate) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"  generator = 1\n"
"build out.imp: touch | in\n"));
  fs_.Create("out.imp", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;

  EXPECT_TRUE(builder_.AddTarget("out.imp", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());

  EXPECT_TRUE(GetNode("out.imp")->dirty());
}